

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O1

void ScaleARGBRowDown2_SSE2(uint8_t *src_argb,ptrdiff_t src_stride,uint8_t *dst_argb,int dst_width)

{
  bool bVar1;
  uint8_t *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  
  do {
    puVar2 = src_argb + 4;
    uVar3 = *(undefined4 *)(src_argb + 0xc);
    uVar4 = *(undefined4 *)(src_argb + 0x14);
    uVar5 = *(undefined4 *)(src_argb + 0x1c);
    src_argb = src_argb + 0x20;
    *(undefined4 *)dst_argb = *(undefined4 *)puVar2;
    *(undefined4 *)(dst_argb + 4) = uVar3;
    *(undefined4 *)(dst_argb + 8) = uVar4;
    *(undefined4 *)(dst_argb + 0xc) = uVar5;
    dst_argb = dst_argb + 0x10;
    iVar6 = dst_width + -4;
    bVar1 = 3 < dst_width;
    dst_width = iVar6;
  } while (iVar6 != 0 && bVar1);
  return;
}

Assistant:

void ScaleARGBRowDown2_SSE2(const uint8_t* src_argb,
                            ptrdiff_t src_stride,
                            uint8_t* dst_argb,
                            int dst_width) {
  (void)src_stride;
  asm volatile(

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "lea         0x20(%0),%0                   \n"
      "shufps      $0xdd,%%xmm1,%%xmm0           \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x4,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_argb),  // %0
        "+r"(dst_argb),  // %1
        "+r"(dst_width)  // %2
        ::"memory",
        "cc", "xmm0", "xmm1");
}